

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taiwncal.cpp
# Opt level: O0

void __thiscall
icu_63::TaiwanCalendar::handleComputeFields
          (TaiwanCalendar *this,int32_t julianDay,UErrorCode *status)

{
  int32_t iVar1;
  int value;
  int32_t y;
  UErrorCode *status_local;
  int32_t julianDay_local;
  TaiwanCalendar *this_local;
  
  GregorianCalendar::handleComputeFields(&this->super_GregorianCalendar,julianDay,status);
  iVar1 = Calendar::internalGet((Calendar *)this,UCAL_EXTENDED_YEAR);
  value = iVar1 + -0x777;
  if (value < 1) {
    Calendar::internalSet((Calendar *)this,UCAL_ERA,0);
    Calendar::internalSet((Calendar *)this,UCAL_YEAR,1 - value);
  }
  else {
    Calendar::internalSet((Calendar *)this,UCAL_ERA,1);
    Calendar::internalSet((Calendar *)this,UCAL_YEAR,value);
  }
  return;
}

Assistant:

void TaiwanCalendar::handleComputeFields(int32_t julianDay, UErrorCode& status)
{
    GregorianCalendar::handleComputeFields(julianDay, status);
    int32_t y = internalGet(UCAL_EXTENDED_YEAR) - kTaiwanEraStart;
    if(y>0) {
        internalSet(UCAL_ERA, MINGUO);
        internalSet(UCAL_YEAR, y);
    } else {
        internalSet(UCAL_ERA, BEFORE_MINGUO);
        internalSet(UCAL_YEAR, 1-y);
    }
}